

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::BufferStorage::MapPersistentDispatchTest::iterate(MapPersistentDispatchTest *this)

{
  ostringstream *poVar1;
  int iVar2;
  GLuint GVar3;
  GLenum GVar4;
  int iVar5;
  undefined4 extraout_var;
  GLuint GVar6;
  long lVar7;
  void *__s1;
  GLuint *pGVar8;
  char *description;
  qpTestResult testResult;
  GLuint GVar9;
  MoveMapOwner MVar10;
  allocator<char> local_43e;
  allocator<char> local_43d;
  allocator<char> local_43c;
  allocator<char> local_43b;
  allocator<char> local_43a;
  allocator<char> local_439;
  Buffer source;
  MapOwner source_map;
  MapOwner destination_map;
  Buffer destination;
  Program program;
  string local_358;
  string local_338;
  string local_318;
  GLuint modified_source_data [16];
  GLuint sum_data [16];
  GLuint source_data [16];
  GLuint modified_sum_data [16];
  GLuint destination_data [16];
  undefined4 auStack_1b8 [2];
  undefined1 local_1b0 [384];
  Functions *gl;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  GVar3 = 0;
  GVar6 = 0x10;
  GVar9 = 0;
  for (lVar7 = -0x10; lVar7 != 0; lVar7 = lVar7 + 1) {
    auStack_1b8[lVar7] = 0;
    sum_data[lVar7] = GVar6;
    modified_sum_data[lVar7] = (int)lVar7 + 0x10;
    GVar3 = GVar3 + GVar6;
    GVar9 = GVar9 + (int)lVar7 + 0x10;
    destination_data[lVar7] = GVar3;
    source_data[lVar7] = GVar9;
    GVar6 = GVar6 - 1;
  }
  source.m_context = (this->super_TestCase).m_context;
  destination.m_id = 0xffffffff;
  source.m_id = 0xffffffff;
  destination.m_target = 0x8892;
  source.m_target = 0x8892;
  destination.m_context = source.m_context;
  BufferStorage::Buffer::InitStorage(&destination,0x90d2,0xc1,0x40,destination_data);
  BufferStorage::Buffer::InitStorage(&source,0x90d2,0xc2,0x40,source_data);
  program.m_compute.m_context = (this->super_TestCase).m_context;
  program.m_id = 0;
  program.m_compute.m_id = 0;
  program.m_fragment.m_id = 0;
  program.m_geometry.m_id = 0;
  program.m_tess_ctrl.m_id = 0;
  program.m_tess_eval.m_id = 0;
  program.m_vertex.m_id = 0;
  program.m_fragment.m_context = program.m_compute.m_context;
  program.m_geometry.m_context = program.m_compute.m_context;
  program.m_tess_ctrl.m_context = program.m_compute.m_context;
  program.m_tess_eval.m_context = program.m_compute.m_context;
  program.m_vertex.m_context = program.m_compute.m_context;
  program.m_context = program.m_compute.m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,
             "#version 430 core\n\nlayout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n\nlayout (binding = 0, std430) buffer DestinationData {\n    uint values[];\n} destination;\n\nlayout (binding = 1, std430) buffer SourceData {\n    uint values[];\n} source;\n\nvoid main()\n{\n    uint index = gl_GlobalInvocationID.x;\n    uint sum   = 0u;\n\n    for (uint i = 0u; i <= index; ++i)\n    {\n        sum += source.values[i];\n    }\n\n    destination.values[index] = sum;\n}\n\n"
             ,&local_439);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&destination_map,glcts::fixed_sample_locations_values + 1,&local_43a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&source_map,glcts::fixed_sample_locations_values + 1,&local_43b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,glcts::fixed_sample_locations_values + 1,&local_43c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,glcts::fixed_sample_locations_values + 1,&local_43d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_318,glcts::fixed_sample_locations_values + 1,&local_43e);
  BufferStorage::Program::Init
            (&program,(string *)local_1b0,(string *)&destination_map,(string *)&source_map,
             &local_338,&local_358,&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&source_map);
  std::__cxx11::string::~string((string *)&destination_map);
  std::__cxx11::string::~string((string *)local_1b0);
  BufferStorage::Program::Use(gl,program.m_id);
  BufferStorage::Buffer::Bind(&destination);
  MVar10 = BufferStorage::Buffer::MapRange(&destination,0,0x40,0xc1);
  __s1 = MVar10.data;
  destination_map.m_buffer = MVar10.buffer;
  destination_map.m_data = __s1;
  BufferStorage::Buffer::Bind(&source);
  MVar10 = BufferStorage::Buffer::MapRange(&source,0,0x40,0xc2);
  pGVar8 = (GLuint *)MVar10.data;
  source_map.m_buffer = MVar10.buffer;
  source_map.m_data = pGVar8;
  BufferStorage::Buffer::Bind(gl,0,0x90d2);
  BufferStorage::Buffer::BindBase(gl,destination.m_id,0x90d2,0);
  BufferStorage::Buffer::BindBase(gl,source.m_id,0x90d2,1);
  (*gl->dispatchCompute)(0x10,1,1);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"DispatchCompute with persistently mapped buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xc04);
  (*gl->finish)();
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"Finish",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xc08);
  iVar2 = bcmp(__s1,sum_data,0x40);
  if (iVar2 != 0) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Contents of mapped region does not correspond with expected results");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  *(undefined8 *)(pGVar8 + 0xc) = modified_source_data._48_8_;
  *(undefined8 *)(pGVar8 + 0xe) = modified_source_data._56_8_;
  *(undefined8 *)(pGVar8 + 8) = modified_source_data._32_8_;
  *(undefined8 *)(pGVar8 + 10) = modified_source_data._40_8_;
  *(undefined8 *)(pGVar8 + 4) = modified_source_data._16_8_;
  *(undefined8 *)(pGVar8 + 6) = modified_source_data._24_8_;
  *(undefined8 *)pGVar8 = modified_source_data._0_8_;
  *(undefined8 *)(pGVar8 + 2) = modified_source_data._8_8_;
  testResult = QP_TEST_RESULT_FAIL;
  (*gl->dispatchCompute)(0x10,1,1);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"DispatchCompute with persistently mapped buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xc18);
  (*gl->finish)();
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"Finish",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0xc1c);
  iVar5 = bcmp(__s1,modified_sum_data,0x40);
  if (iVar5 == 0) {
    BufferStorage::Buffer::MapOwner::~MapOwner(&source_map);
    BufferStorage::Buffer::MapOwner::~MapOwner(&destination_map);
    if (iVar2 == 0) {
      testResult = QP_TEST_RESULT_PASS;
      description = "Pass";
      goto LAB_00941b3d;
    }
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Contents of mapped region does not correspond with expected results");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    BufferStorage::Buffer::MapOwner::~MapOwner(&source_map);
    BufferStorage::Buffer::MapOwner::~MapOwner(&destination_map);
  }
  description = "Fail";
LAB_00941b3d:
  tcu::TestContext::setTestResult
            (((this->super_TestCase).m_context)->m_testCtx,testResult,description);
  BufferStorage::Program::~Program(&program);
  BufferStorage::Buffer::~Buffer(&source);
  BufferStorage::Buffer::~Buffer(&destination);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MapPersistentDispatchTest::iterate()
{
	static const GLchar* compute_shader = "#version 430 core\n"
										  "\n"
										  "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
										  "\n"
										  "layout (binding = 0, std430) buffer DestinationData {\n"
										  "    uint values[];\n"
										  "} destination;\n"
										  "\n"
										  "layout (binding = 1, std430) buffer SourceData {\n"
										  "    uint values[];\n"
										  "} source;\n"
										  "\n"
										  "void main()\n"
										  "{\n"
										  "    uint index = gl_GlobalInvocationID.x;\n"
										  "    uint sum   = 0u;\n"
										  "\n"
										  "    for (uint i = 0u; i <= index; ++i)\n"
										  "    {\n"
										  "        sum += source.values[i];\n"
										  "    }\n"
										  "\n"
										  "    destination.values[index] = sum;\n"
										  "}\n"
										  "\n";
	static const GLuint data_size			= 16;
	static const GLuint destination_binding = 0;
	static const GLuint source_binding		= 1;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool test_result = true;

	/* Prepare data */
	GLuint destination_data[data_size];
	GLuint modified_source_data[data_size];
	GLuint modified_sum_data[data_size];
	GLuint source_data[data_size];
	GLuint sum_data[data_size];

	GLuint modified_sum = 0;
	GLuint sum			= 0;

	for (GLuint i = 0; i < data_size; ++i)
	{
		destination_data[i]		= 0;
		modified_source_data[i] = data_size - i;
		source_data[i]			= i;

		modified_sum += modified_source_data[i];
		sum += source_data[i];

		modified_sum_data[i] = modified_sum;
		sum_data[i]			 = sum;
	}

	/* Prepare buffers */
	Buffer destination(m_context);
	Buffer source(m_context);

	destination.InitStorage(GL_SHADER_STORAGE_BUFFER, GL_MAP_COHERENT_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_READ_BIT,
							data_size * sizeof(GLuint), destination_data);

	source.InitStorage(GL_SHADER_STORAGE_BUFFER, GL_MAP_COHERENT_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_WRITE_BIT,
					   data_size * sizeof(GLuint), source_data);

	/* Prepare program */
	Program program(m_context);
	program.Init(compute_shader, "" /* fs */, "" /* gs */, "" /* tcs */, "" /* tes */, "" /* vs */);

	/*
	 * - bind buffers to SHADER_STORAGE_BUFFER;
	 * - use MapBufferRange to map both buffers; <access> shall be set as follows:
	 *   * MAP_COHERENT_BIT and MAP_PERSISTENT_BIT flags set for both
	 *   * MAP_WRITE_BIT flag shall be set for source;
	 *   * MAP_READ_BIT flag shall be set for destination;
	 * - dispatch program for 16x1x1 groups;
	 * - modify contents of source buffer via mapped memory;
	 * - execute Finish;
	 * - inspect contents of destination buffer via mapped memory; It is expected
	 * that it will contain results based on original content of source buffer;
	 * - dispatch program for 16x1x1 groups;
	 * - execute Finish;
	 * - inspect contents of destination buffer via mapped memory; It is expected
	 * that it will contain results based on modified content of source buffer.
	 */
	{
		/* Set program */
		Program::Use(gl, program.m_id);

		/* Map buffers */
		destination.Bind();
		const Buffer::MapOwner destination_map(destination.MapRange(
			0 /* offset */, data_size * sizeof(GLuint), GL_MAP_COHERENT_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_READ_BIT));

		source.Bind();
		const Buffer::MapOwner source_map(
			source.MapRange(0 /* offset */, data_size * sizeof(GLuint),
							GL_MAP_COHERENT_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_WRITE_BIT));

		/* Clear binding point */
		Buffer::Bind(gl, 0, GL_SHADER_STORAGE_BUFFER);

		/* Bind buffers */
		Buffer::BindBase(gl, destination.m_id, GL_SHADER_STORAGE_BUFFER, destination_binding);
		Buffer::BindBase(gl, source.m_id, GL_SHADER_STORAGE_BUFFER, source_binding);

		/* Execute program for 16x1x1 groups */
		gl.dispatchCompute(16, 1, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute with persistently mapped buffers");

		/* Make sure that program executed */
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "Finish");

		if (0 != memcmp(destination_map.m_data, sum_data, data_size * sizeof(GLuint)))
		{
			test_result = false;

			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Contents of mapped region does not correspond with expected results"
												<< tcu::TestLog::EndMessage;
		}

		/* Modify source buffer via mapped area */
		memcpy(source_map.m_data, modified_source_data, data_size * sizeof(GLuint));

		/* Execute program for 16x1x1 groups */
		gl.dispatchCompute(16, 1, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute with persistently mapped buffers");

		/* Make sure that program executed */
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "Finish");

		if (0 != memcmp(destination_map.m_data, modified_sum_data, data_size * sizeof(GLuint)))
		{
			test_result = false;

			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Contents of mapped region does not correspond with expected results"
												<< tcu::TestLog::EndMessage;
		}
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}